

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O2

void __thiscall S2PaddedCell::S2PaddedCell(S2PaddedCell *this,S2CellId id,double padding)

{
  int iVar1;
  ulong uVar2;
  int ij [2];
  S2CellId id_local;
  R2Rect local_70;
  R2Rect local_50;
  
  (this->id_).id_ = id.id_;
  this->padding_ = padding;
  (this->bound_).bounds_[0].bounds_.c_[0] = 1.0;
  (this->bound_).bounds_[0].bounds_.c_[1] = 0.0;
  (this->bound_).bounds_[1].bounds_.c_[0] = 1.0;
  (this->bound_).bounds_[1].bounds_.c_[1] = 0.0;
  (this->middle_).bounds_[0].bounds_.c_[0] = 1.0;
  (this->middle_).bounds_[0].bounds_.c_[1] = 0.0;
  (this->middle_).bounds_[1].bounds_.c_[0] = 1.0;
  (this->middle_).bounds_[1].bounds_.c_[1] = 0.0;
  id_local = id;
  if ((id.id_ & 0xfffffffffffffff) == 0) {
    local_70.bounds_[0].bounds_.c_[1] = padding + 1.0;
    ij = (int  [2])-local_70.bounds_[0].bounds_.c_[1];
    local_70.bounds_[0].bounds_.c_[0] = (VType)ij;
    R2Rect::R2Rect(&local_50,local_70.bounds_,(R1Interval *)ij);
    (this->bound_).bounds_[1].bounds_.c_[0] = local_50.bounds_[1].bounds_.c_[0];
    (this->bound_).bounds_[1].bounds_.c_[1] = local_50.bounds_[1].bounds_.c_[1];
    (this->bound_).bounds_[0].bounds_.c_[0] = local_50.bounds_[0].bounds_.c_[0];
    (this->bound_).bounds_[0].bounds_.c_[1] = local_50.bounds_[0].bounds_.c_[1];
    ij = (int  [2])((ulong)padding ^ 0x8000000000000000);
    local_70.bounds_[0].bounds_.c_[0] = (VType)ij;
    local_70.bounds_[0].bounds_.c_[1] = padding;
    R2Rect::R2Rect(&local_50,local_70.bounds_,(R1Interval *)ij);
    (this->middle_).bounds_[1].bounds_.c_[0] = local_50.bounds_[1].bounds_.c_[0];
    (this->middle_).bounds_[1].bounds_.c_[1] = local_50.bounds_[1].bounds_.c_[1];
    (this->middle_).bounds_[0].bounds_.c_[0] = local_50.bounds_[0].bounds_.c_[0];
    (this->middle_).bounds_[0].bounds_.c_[1] = local_50.bounds_[0].bounds_.c_[1];
    this->orientation_ = (uint)((this->id_).id_ >> 0x3d) & 1;
    this->level_ = 0;
    uVar2 = 0;
  }
  else {
    S2CellId::ToFaceIJOrientation(&id_local,ij,ij + 1,&this->orientation_);
    iVar1 = S2CellId::level(&id_local);
    this->level_ = iVar1;
    S2CellId::IJLevelToBoundUV(&local_70,ij,iVar1);
    R2Rect::Expanded(&local_50,&local_70,padding);
    (this->bound_).bounds_[1].bounds_.c_[0] = local_50.bounds_[1].bounds_.c_[0];
    (this->bound_).bounds_[1].bounds_.c_[1] = local_50.bounds_[1].bounds_.c_[1];
    (this->bound_).bounds_[0].bounds_.c_[0] = local_50.bounds_[0].bounds_.c_[0];
    (this->bound_).bounds_[0].bounds_.c_[1] = local_50.bounds_[0].bounds_.c_[1];
    iVar1 = -1 << (0x1eU - (char)this->level_ & 0x1f);
    uVar2 = CONCAT44(iVar1,iVar1) & (ulong)ij;
  }
  *(ulong *)this->ij_lo_ = uVar2;
  return;
}

Assistant:

S2PaddedCell::S2PaddedCell(S2CellId id, double padding)
    : id_(id), padding_(padding) {
  if (id_.is_face()) {
    // Fast path for constructing a top-level face (the most common case).
    double limit = 1 + padding;
    bound_ = R2Rect(R1Interval(-limit, limit), R1Interval(-limit, limit));
    middle_ = R2Rect(R1Interval(-padding, padding),
                     R1Interval(-padding, padding));
    ij_lo_[0] = ij_lo_[1] = 0;
    orientation_ = id_.face() & 1;
    level_ = 0;
  } else {
    int ij[2];
    id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation_);
    level_ = id.level();
    bound_ = S2CellId::IJLevelToBoundUV(ij, level_).Expanded(padding);
    int ij_size = S2CellId::GetSizeIJ(level_);
    ij_lo_[0] = ij[0] & -ij_size;
    ij_lo_[1] = ij[1] & -ij_size;
  }
}